

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world_shuffler.cpp
# Opt level: O1

void __thiscall WorldShuffler::randomize_fox_hints(WorldShuffler *this)

{
  RandomizerOptions *pRVar1;
  HintSource *hint_source_00;
  bool bVar2;
  __normal_iterator<HintSource_*const_*,_std::vector<HintSource_*,_std::allocator<HintSource_*>_>_>
  _Var3;
  LandstalkerException *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  ushort uVar6;
  ulong __new_size;
  ushort uVar7;
  pointer ppHVar8;
  pointer ppHVar9;
  HintSource *hint_source;
  vector<HintSource_*,_std::allocator<HintSource_*>_> foxes_pool;
  undefined1 local_128 [36];
  uint local_104;
  uint local_100;
  uint local_fc;
  vector<HintSource_*,_std::allocator<HintSource_*>_> local_f8;
  pointer local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pRVar1 = this->_options;
  uVar7 = (ushort)pRVar1->_hints_distribution_item_requirement;
  local_fc = (uint)pRVar1->_hints_distribution_region_requirement;
  uVar6 = (ushort)pRVar1->_hints_distribution_dark_region;
  local_100 = (uint)pRVar1->_hints_distribution_item_location;
  local_104 = (uint)pRVar1->_hints_distribution_joke;
  local_f8.super__Vector_base<HintSource_*,_std::allocator<HintSource_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.super__Vector_base<HintSource_*,_std::allocator<HintSource_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.super__Vector_base<HintSource_*,_std::allocator<HintSource_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppHVar9 = (this->_world->_hint_sources).
            super__Vector_base<HintSource_*,_std::allocator<HintSource_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppHVar8 = (this->_world->_hint_sources).
                 super__Vector_base<HintSource_*,_std::allocator<HintSource_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppHVar8 != ppHVar9; ppHVar8 = ppHVar8 + 1) {
    local_128._0_8_ = *ppHVar8;
    _Var3 = std::
            __find_if<__gnu_cxx::__normal_iterator<HintSource*const*,std::vector<HintSource*,std::allocator<HintSource*>>>,__gnu_cxx::__ops::_Iter_equals_val<HintSource*const>>
                      ((this->_world->_used_hint_sources).
                       super__Vector_base<HintSource_*,_std::allocator<HintSource_*>_>._M_impl.
                       super__Vector_impl_data._M_start,
                       (this->_world->_used_hint_sources).
                       super__Vector_base<HintSource_*,_std::allocator<HintSource_*>_>._M_impl.
                       super__Vector_impl_data._M_finish,local_128);
    if ((_Var3._M_current ==
         (this->_world->_used_hint_sources).
         super__Vector_base<HintSource_*,_std::allocator<HintSource_*>_>._M_impl.
         super__Vector_impl_data._M_finish) &&
       ((((vector<unsigned_short,_std::allocator<unsigned_short>_> *)(local_128._0_8_ + 0x70))->
        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
        super__Vector_impl_data._M_start != *(pointer *)(local_128._0_8_ + 0x78))) {
      std::vector<HintSource*,std::allocator<HintSource*>>::emplace_back<HintSource*&>
                ((vector<HintSource*,std::allocator<HintSource*>> *)&local_f8,
                 (HintSource **)local_128);
    }
  }
  vectools::shuffle<HintSource*>(&local_f8,&this->_rng);
  pRVar1 = this->_options;
  __new_size = (ulong)pRVar1->_hints_distribution_joke +
               (ulong)pRVar1->_hints_distribution_dark_region +
               (ulong)pRVar1->_hints_distribution_item_location +
               (ulong)pRVar1->_hints_distribution_item_requirement +
               (ulong)pRVar1->_hints_distribution_region_requirement;
  if ((ulong)((long)local_f8.super__Vector_base<HintSource_*,_std::allocator<HintSource_*>_>._M_impl
                    .super__Vector_impl_data._M_finish -
              (long)local_f8.super__Vector_base<HintSource_*,_std::allocator<HintSource_*>_>._M_impl
                    .super__Vector_impl_data._M_start >> 3) < __new_size) {
    this_00 = (LandstalkerException *)__cxa_allocate_exception(0x28);
    pRVar1 = this->_options;
    std::__cxx11::to_string
              (&local_90,
               (uint)pRVar1->_hints_distribution_joke +
               (uint)pRVar1->_hints_distribution_dark_region +
               (uint)pRVar1->_hints_distribution_item_location +
               (uint)pRVar1->_hints_distribution_item_requirement +
               (uint)pRVar1->_hints_distribution_region_requirement);
    std::operator+(&local_70,"Hints count (",&local_90);
    pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_70,") is bigger than foxes pool size (");
    local_d0._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
    paVar5 = &pbVar4->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p == paVar5) {
      local_d0.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
      local_d0.field_2._8_8_ = *(size_type *)((long)&pbVar4->field_2 + 8);
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    }
    else {
      local_d0.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    }
    local_d0._M_string_length = pbVar4->_M_string_length;
    (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
    pbVar4->_M_string_length = 0;
    (pbVar4->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::to_string
              (&local_b0,
               (long)local_f8.super__Vector_base<HintSource_*,_std::allocator<HintSource_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_f8.super__Vector_base<HintSource_*,_std::allocator<HintSource_*>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3);
    std::operator+(&local_50,&local_d0,&local_b0);
    pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_50,").");
    local_128._0_8_ = (pbVar4->_M_dataplus)._M_p;
    paVar5 = &pbVar4->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._0_8_ == paVar5) {
      local_128._16_8_ = paVar5->_M_allocated_capacity;
      local_128._24_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
      local_128._0_8_ = (HintSource *)(local_128 + 0x10);
    }
    else {
      local_128._16_8_ = paVar5->_M_allocated_capacity;
    }
    local_128._8_8_ = pbVar4->_M_string_length;
    (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
    pbVar4->_M_string_length = 0;
    (pbVar4->field_2)._M_local_buf[0] = '\0';
    LandstalkerException::LandstalkerException(this_00,(string *)local_128);
    __cxa_throw(this_00,&LandstalkerException::typeinfo,LandstalkerException::~LandstalkerException)
    ;
  }
  std::vector<HintSource_*,_std::allocator<HintSource_*>_>::resize(&local_f8,__new_size);
  if (local_f8.super__Vector_base<HintSource_*,_std::allocator<HintSource_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_f8.super__Vector_base<HintSource_*,_std::allocator<HintSource_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_d8 = local_f8.super__Vector_base<HintSource_*,_std::allocator<HintSource_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
    ppHVar8 = local_f8.super__Vector_base<HintSource_*,_std::allocator<HintSource_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppHVar9 = local_f8.super__Vector_base<HintSource_*,_std::allocator<HintSource_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    do {
      hint_source_00 = *ppHVar8;
      local_128._0_8_ = hint_source_00;
      std::vector<HintSource*,std::allocator<HintSource*>>::emplace_back<HintSource*&>
                ((vector<HintSource*,std::allocator<HintSource*>> *)
                 &this->_world->_used_hint_sources,(HintSource **)local_128);
      if ((uVar6 == 0) || (bVar2 = generate_dark_region_hint(this,hint_source_00), !bVar2)) {
        if ((uVar7 == 0) || (bVar2 = generate_item_requirement_hint(this,hint_source_00), !bVar2)) {
          if (((short)local_fc == 0) ||
             (bVar2 = generate_region_requirement_hint(this,hint_source_00), !bVar2)) {
            if (((short)local_100 == 0) ||
               (bVar2 = generate_item_location_hint(this,hint_source_00), !bVar2)) {
              if ((short)local_104 == 0) {
                local_128._0_8_ = local_128 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_128,"I was meant to say something but... I forgot.","");
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                _M_assign(&hint_source_00->_text,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_128);
                ppHVar9 = local_d8;
                if ((HintSource *)local_128._0_8_ != (HintSource *)(local_128 + 0x10)) {
                  operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
                  ppHVar9 = local_d8;
                }
              }
              else {
                local_128._0_8_ = local_128 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_128,"I don\'t have anything to tell you. Move on.","");
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                _M_assign(&hint_source_00->_text,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_128);
                if ((HintSource *)local_128._0_8_ != (HintSource *)(local_128 + 0x10)) {
                  operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
                }
                local_104 = local_104 - 1;
                ppHVar9 = local_d8;
              }
            }
            else {
              local_100 = local_100 - 1;
            }
          }
          else {
            local_fc = local_fc - 1;
          }
        }
        else {
          uVar7 = uVar7 - 1;
        }
      }
      else {
        uVar6 = uVar6 - 1;
      }
      ppHVar8 = ppHVar8 + 1;
    } while (ppHVar8 != ppHVar9);
  }
  if (local_f8.super__Vector_base<HintSource_*,_std::allocator<HintSource_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.super__Vector_base<HintSource_*,_std::allocator<HintSource_*>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_f8.super__Vector_base<HintSource_*,_std::allocator<HintSource_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.super__Vector_base<HintSource_*,_std::allocator<HintSource_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void WorldShuffler::randomize_fox_hints()
{
    uint16_t remaining_item_requirement_hints = _options.hints_distribution_item_requirement();
    uint16_t remaining_region_requirement_hints = _options.hints_distribution_region_requirement();
    uint16_t remaining_dark_region_hints = _options.hints_distribution_dark_region();
    uint16_t remaining_item_location_hints = _options.hints_distribution_item_location();
    uint16_t remaining_joke_hints = _options.hints_distribution_joke();

    std::vector<HintSource*> foxes_pool;
    for(HintSource* hint_source : _world.hint_sources())
    {
        if(std::find(_world.used_hint_sources().begin(), _world.used_hint_sources().end(), hint_source) != _world.used_hint_sources().end())
            continue;
        if(hint_source->special())
            continue;

        foxes_pool.emplace_back(hint_source);
    }

    vectools::shuffle(foxes_pool, _rng);

    if(_options.hints_count() > foxes_pool.size())
    {
        throw LandstalkerException("Hints count (" + std::to_string(_options.hints_count())
                                   + ") is bigger than foxes pool size (" + std::to_string(foxes_pool.size()) +").");
    }
    foxes_pool.resize(_options.hints_count());

    // Put hints inside
    for(HintSource* hint_source : foxes_pool)
    {
        _world.add_used_hint_source(hint_source);

        if(remaining_dark_region_hints > 0)
        {
            if(this->generate_dark_region_hint(hint_source))
            {
                remaining_dark_region_hints--;
                continue;
            }
        }
        if(remaining_item_requirement_hints > 0)
        {
            if(this->generate_item_requirement_hint(hint_source))
            {
                remaining_item_requirement_hints--;
                continue;
            }
        }
        if(remaining_region_requirement_hints > 0)
        {
            if(this->generate_region_requirement_hint(hint_source))
            {
                remaining_region_requirement_hints--;
                continue;
            }
        }
        if(remaining_item_location_hints > 0)
        {
            if(this->generate_item_location_hint(hint_source))
            {
                remaining_item_location_hints--;
                continue;
            }
        }
        if(remaining_joke_hints > 0)
        {
            hint_source->text("I don't have anything to tell you. Move on.");
            remaining_joke_hints--;
            continue;
        }

        // Fallback if none of the options above were matching
        hint_source->text("I was meant to say something but... I forgot.");
    }
}